

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O3

_Bool tval_is_ammo(object *obj)

{
  return (byte)(obj->tval - 2) < 3;
}

Assistant:

bool tval_is_ammo(const struct object *obj)
{
	switch (obj->tval) {
		case TV_SHOT:
		case TV_ARROW:
		case TV_BOLT:
			return true;
		default:
			return false;
	}
}